

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O3

XrResult GenValidUsageNextXrDestroyFacialExpressionClientML
                   (XrFacialExpressionClientML facialExpressionClient)

{
  XrResult XVar1;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar2;
  
  pVar2 = HandleInfo<XrFacialExpressionClientML_T_*>::getWithInstanceInfo
                    (&g_facialexpressionclientml_info,facialExpressionClient);
  XVar1 = (*(pVar2.second)->dispatch_table->DestroyFacialExpressionClientML)(facialExpressionClient)
  ;
  if (XR_ERROR_VALIDATION_FAILURE < XVar1) {
    HandleInfoBase<XrFacialExpressionClientML_T_*,_GenValidUsageXrHandleInfo>::erase
              (&g_facialexpressionclientml_info.
                super_HandleInfoBase<XrFacialExpressionClientML_T_*,_GenValidUsageXrHandleInfo>,
               facialExpressionClient);
  }
  return XVar1;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL GenValidUsageNextXrDestroyFacialExpressionClientML(
    XrFacialExpressionClientML facialExpressionClient) {
    XrResult result = XR_SUCCESS;
    try {
        auto info_with_instance = g_facialexpressionclientml_info.getWithInstanceInfo(facialExpressionClient);
        GenValidUsageXrHandleInfo *gen_facialexpressionclientml_info = info_with_instance.first;
        (void)gen_facialexpressionclientml_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        result = gen_instance_info->dispatch_table->DestroyFacialExpressionClientML(facialExpressionClient);
        if (XR_SUCCEEDED(result)) {
            g_facialexpressionclientml_info.erase(facialExpressionClient);
        }
    } catch (...) {
        result = XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}